

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

int SSL_CTX_set_compliance_policy(SSL_CTX *ctx,ssl_compliance_policy_t policy)

{
  int iVar1;
  size_t num_prefs;
  undefined1 *prefs;
  bool bVar2;
  
  if (policy == ssl_compliance_policy_cnsa_202407) {
    ctx->compliance_policy = ssl_compliance_policy_cnsa_202407;
    bVar2 = true;
    goto LAB_001599ac;
  }
  if (policy == ssl_compliance_policy_wpa3_192_202304) {
    ctx->compliance_policy = ssl_compliance_policy_wpa3_192_202304;
    iVar1 = SSL_CTX_set_min_proto_version(ctx,0x303);
    if (iVar1 != 0) {
      iVar1 = SSL_CTX_set_max_proto_version(ctx,0x304);
      if (iVar1 != 0) {
        iVar1 = SSL_CTX_set_strict_cipher_list
                          (ctx,
                           "TLS_ECDHE_ECDSA_WITH_AES_256_GCM_SHA384:TLS_ECDHE_RSA_WITH_AES_256_GCM_SHA384"
                          );
        if (iVar1 != 0) {
          iVar1 = SSL_CTX_set1_group_ids(ctx,&wpa202304::kGroups,1);
          if (iVar1 != 0) {
            iVar1 = SSL_CTX_set_signing_algorithm_prefs(ctx,(uint16_t *)wpa202304::kSigAlgs,5);
            if (iVar1 != 0) {
              prefs = wpa202304::kSigAlgs;
              num_prefs = 5;
LAB_0015998d:
              iVar1 = SSL_CTX_set_verify_algorithm_prefs(ctx,(uint16_t *)prefs,num_prefs);
              bVar2 = iVar1 != 0;
              goto LAB_001599ac;
            }
          }
        }
      }
    }
  }
  else if (policy == ssl_compliance_policy_fips_202205) {
    ctx->compliance_policy = ssl_compliance_policy_fips_202205;
    iVar1 = SSL_CTX_set_min_proto_version(ctx,0x303);
    if (iVar1 != 0) {
      iVar1 = SSL_CTX_set_max_proto_version(ctx,0x304);
      if (iVar1 != 0) {
        iVar1 = SSL_CTX_set_strict_cipher_list
                          (ctx,
                           "TLS_ECDHE_ECDSA_WITH_AES_128_GCM_SHA256:TLS_ECDHE_RSA_WITH_AES_128_GCM_SHA256:TLS_ECDHE_ECDSA_WITH_AES_256_GCM_SHA384:TLS_ECDHE_RSA_WITH_AES_256_GCM_SHA384"
                          );
        if (iVar1 != 0) {
          iVar1 = SSL_CTX_set1_group_ids(ctx,(uint16_t *)&fips202205::kGroups,2);
          if (iVar1 != 0) {
            iVar1 = SSL_CTX_set_signing_algorithm_prefs(ctx,(uint16_t *)fips202205::kSigAlgs,8);
            if (iVar1 != 0) {
              prefs = fips202205::kSigAlgs;
              num_prefs = 8;
              goto LAB_0015998d;
            }
          }
        }
      }
    }
  }
  bVar2 = false;
LAB_001599ac:
  return (int)bVar2;
}

Assistant:

int SSL_CTX_set_compliance_policy(SSL_CTX *ctx,
                                  enum ssl_compliance_policy_t policy) {
  switch (policy) {
    case ssl_compliance_policy_fips_202205:
      return fips202205::Configure(ctx);
    case ssl_compliance_policy_wpa3_192_202304:
      return wpa202304::Configure(ctx);
    case ssl_compliance_policy_cnsa_202407:
      return cnsa202407::Configure(ctx);
    default:
      return 0;
  }
}